

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  byte bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  size_t numberOfRows;
  size_t numberOfColumns;
  _Self __tmp;
  ostringstream errorMsg;
  char *local_1c8 [4];
  ostringstream local_1a8 [376];
  
  p_Var4 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = 1;
  do {
    pOVar1 = this->m_pimpl;
    if ((bVar2 & 1) == 0) {
      if ((pOVar1->dynamicalSystem).
          super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,
                        "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                       );
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","costsSecondPartialDerivativeWRTControlSparsity",
                   local_1c8[0]);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        bVar3 = false;
      }
      else {
        SparsityStructure::clear(&pOVar1->costsControlHessianSparsity);
        pOVar1 = this->m_pimpl;
        numberOfRows = DynamicalSystem::controlSpaceSize
                                 ((pOVar1->dynamicalSystem).
                                  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
        numberOfColumns =
             DynamicalSystem::controlSpaceSize
                       ((this->m_pimpl->dynamicalSystem).
                        super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        SparsityStructure::addDenseBlock
                  (&pOVar1->costsControlHessianSparsity,0,0,numberOfRows,numberOfColumns);
LAB_00180c65:
        SparsityStructure::operator=(controlSparsity,&this->m_pimpl->costsControlHessianSparsity);
        bVar3 = true;
      }
      return bVar3;
    }
    if ((_Rb_tree_header *)p_Var4 == &(pOVar1->costs)._M_t._M_impl.super__Rb_tree_header) {
      SparsityStructure::clear(&pOVar1->costsControlHessianSparsity);
      pOVar1 = this->m_pimpl;
      for (p_Var4 = (pOVar1->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pOVar1->costs)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        SparsityStructure::merge
                  (&this->m_pimpl->costsControlHessianSparsity,
                   (SparsityStructure *)&p_Var4[0xc]._M_right);
      }
      goto LAB_00180c65;
    }
    bVar2 = (**(code **)(**(long **)(p_Var4 + 2) + 0x50))();
    *(byte *)((long)&p_Var4[0x13]._M_parent + 1) = bVar2;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            bool allHaveSparsity = true;

            auto cost = m_pimpl->costs.begin();

            while (allHaveSparsity && cost != m_pimpl->costs.end()) {
                cost->second.hasControlHessianSparsity =
                    cost->second.cost->costSecondPartialDerivativeWRTControlSparsity(cost->second.controlHessianSparsity);
                allHaveSparsity &= cost->second.hasControlHessianSparsity;
                cost++;
            }

            if (allHaveSparsity) {
                m_pimpl->costsControlHessianSparsity.clear();

                for (auto& costPtr : m_pimpl->costs) {
                    m_pimpl->costsControlHessianSparsity.merge(costPtr.second.controlHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->costsControlHessianSparsity.clear();
                    m_pimpl->costsControlHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->controlSpaceSize(), m_pimpl->dynamicalSystem->controlSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                    reportError("OptimalControlProblem", "costsSecondPartialDerivativeWRTControlSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            controlSparsity = m_pimpl->costsControlHessianSparsity;
            return true;
        }